

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-parser.cc
# Opt level: O3

void __thiscall GenParser::visit(GenParser *this,Symbol *sym)

{
  IRBuilder *this_00;
  BasicBlock *pBVar1;
  Name *pNVar2;
  Temp *target;
  Result *pRVar3;
  double __x;
  string local_68;
  long *local_48 [2];
  long local_38 [2];
  
  this_00 = &this->super_IRBuilder;
  if (sym->isTerminal == true) {
    pBVar1 = IR::IRBuilder::newBasicBlock(this_00);
    pNVar2 = IR::IRBuilder::getName(this_00,sym);
    IR::IRBuilder::cjump
              (this_00,&pNVar2->super_Expr,pBVar1,(this->super_CodeGenerator).code.iffalse);
    IR::IRBuilder::place(this_00,pBVar1);
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"yyconsume()","");
    IR::IRBuilder::exp(this_00,__x);
    pRVar3 = &(this->super_CodeGenerator).code;
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
  }
  else {
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    target = IR::IRBuilder::newTemp(this_00,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,
                      CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                               local_68.field_2._M_local_buf[0]) + 1);
    }
    IR::IRBuilder::save(this_00,target);
    pBVar1 = IR::IRBuilder::newBasicBlock(this_00);
    pNVar2 = IR::IRBuilder::getName(this_00,sym);
    IR::IRBuilder::cjump(this_00,&pNVar2->super_Expr,(this->super_CodeGenerator).code.iftrue,pBVar1)
    ;
    IR::IRBuilder::place(this_00,pBVar1);
    IR::IRBuilder::restore(this_00,target);
    pRVar3 = (Result *)&(this->super_CodeGenerator).code.iffalse;
  }
  IR::IRBuilder::jump(this_00,pRVar3->iftrue);
  return;
}

Assistant:

void GenParser::visit(ast::Symbol* sym) {
  if (sym->isTerminal) {
    auto iftrue = newBasicBlock();

    cjump(getName(sym), iftrue, code.iffalse);
    place(iftrue);
    exp("yyconsume()");
    jump(code.iftrue);
    return;
  }

  auto temp = newTemp();
  save(temp);

  auto iffalse = newBasicBlock();

  cjump(getName(sym), code.iftrue, iffalse);

  place(iffalse);
  restore(temp);
  jump(code.iffalse);
}